

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall FfsParser::parsePeImageSectionBody(FfsParser *this,UModelIndex *index)

{
  short sVar1;
  bool bVar2;
  int *piVar3;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 uVar4;
  CBString local_108;
  CBString info;
  UByteArray body;
  CBString local_b8;
  CBString local_a0;
  CBString local_88;
  CBString local_70;
  CBString local_58;
  CBString local_40;
  
  uVar4 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  bVar2 = UModelIndex::isValid(index);
  if (!bVar2) {
    return 1;
  }
  TreeModel::body(&body,this->model,index);
  if (((uint)body.d._M_string_length & 0xffffffc0) == 0) {
    usprintf(&info,"%s: section body size is smaller than DOS header size","parsePeImageSectionBody"
            );
    msg(this,&info,index);
  }
  else {
    Bstrlib::CBString::CBString(&info);
    if (*(short *)body.d._M_dataplus._M_p == 0x5a4d) {
      if ((long)(int)(uint)body.d._M_string_length <
          (long)(ulong)*(uint *)(body.d._M_dataplus._M_p + 0x3c)) {
        Bstrlib::CBString::CBString(&local_108,"\nDOS header: invalid");
        Bstrlib::CBString::operator+=(&info,&local_108);
        Bstrlib::CBString::~CBString(&local_108);
        usprintf(&local_108,"%s: PE32 image with invalid DOS header","parsePeImageSectionBody");
        msg(this,&local_108,index);
      }
      else {
        piVar3 = (int *)(body.d._M_dataplus._M_p + *(uint *)(body.d._M_dataplus._M_p + 0x3c));
        if (*piVar3 == 0x4550) {
          if ((long)(int)(uint)body.d._M_string_length <
              (long)(piVar3 + 1) - (long)body.d._M_dataplus._M_p) {
            Bstrlib::CBString::CBString(&local_108,"\nPE header: invalid");
            Bstrlib::CBString::operator+=(&info,&local_108);
            Bstrlib::CBString::~CBString(&local_108);
            usprintf(&local_108,"%s: PE32 image with invalid PE header","parsePeImageSectionBody");
            msg(this,&local_108,index);
            Bstrlib::CBString::~CBString(&local_108);
            TreeModel::addInfo(this->model,index,&info,true);
          }
          else {
            usprintf(&local_70,"\nDOS signature: %04Xh\nPE signature: %08Xh",0x5a4d,0x4550);
            Bstrlib::CBString::CBString(&local_88,"\nMachine type: ");
            Bstrlib::CBString::operator+(&local_58,&local_70,&local_88);
            machineTypeToUString(&local_a0,*(UINT16 *)(piVar3 + 1));
            Bstrlib::CBString::operator+(&local_40,&local_58,&local_a0);
            usprintf(&local_b8,"\nNumber of sections: %u\nCharacteristics: %04Xh",
                     (ulong)*(ushort *)((long)piVar3 + 6),(ulong)*(ushort *)((long)piVar3 + 0x16));
            Bstrlib::CBString::operator+(&local_108,&local_40,&local_b8);
            Bstrlib::CBString::operator+=(&info,&local_108);
            Bstrlib::CBString::~CBString(&local_108);
            Bstrlib::CBString::~CBString(&local_b8);
            Bstrlib::CBString::~CBString(&local_40);
            Bstrlib::CBString::~CBString(&local_a0);
            Bstrlib::CBString::~CBString(&local_58);
            Bstrlib::CBString::~CBString(&local_88);
            Bstrlib::CBString::~CBString(&local_70);
            if ((long)(int)(uint)body.d._M_string_length <
                (long)(piVar3 + 6) - (long)body.d._M_dataplus._M_p) {
              Bstrlib::CBString::CBString(&local_108,"\nPE optional header: invalid");
              Bstrlib::CBString::operator+=(&info,&local_108);
              Bstrlib::CBString::~CBString(&local_108);
              usprintf(&local_108,"%s: PE32 image with invalid PE optional header",
                       "parsePeImageSectionBody");
              msg(this,&local_108,index);
            }
            else {
              sVar1 = (short)piVar3[6];
              if (sVar1 == 0x20b) {
                usprintf(&local_108,
                         "\nOptional header signature: %04Xh\nSubsystem: %04Xh\nAddress of entry point: %Xh\nBase of code: %Xh\nImage base: %lXh"
                         ,0x20b,(ulong)*(ushort *)(piVar3 + 0x17),(ulong)(uint)piVar3[10],
                         (ulong)(uint)piVar3[0xb],*(undefined8 *)(piVar3 + 0xc));
                Bstrlib::CBString::operator+=(&info,&local_108);
              }
              else if (sVar1 == 0x10b) {
                usprintf(&local_108,
                         "\nOptional header signature: %04Xh\nSubsystem: %04Xh\nAddress of entry point: %Xh\nBase of code: %Xh\nImage base: %Xh"
                         ,0x10b,(ulong)*(ushort *)(piVar3 + 0x17),(ulong)(uint)piVar3[10],
                         (ulong)(uint)piVar3[0xb],CONCAT44(uVar4,piVar3[0xd]));
                Bstrlib::CBString::operator+=(&info,&local_108);
              }
              else {
                usprintf(&local_108,"\nOptional header signature: %04Xh, unknown");
                Bstrlib::CBString::operator+=(&info,&local_108);
                Bstrlib::CBString::~CBString(&local_108);
                usprintf(&local_108,"%s: PE32 image with invalid optional PE header signature",
                         "parsePeImageSectionBody");
                msg(this,&local_108,index);
              }
            }
            Bstrlib::CBString::~CBString(&local_108);
            TreeModel::addInfo(this->model,index,&info,true);
          }
          goto LAB_0012f319;
        }
        usprintf(&local_108,"\nPE signature: %08Xh, invalid");
        Bstrlib::CBString::operator+=(&info,&local_108);
        Bstrlib::CBString::~CBString(&local_108);
        usprintf(&local_108,"%s: PE32 image with invalid PE signature","parsePeImageSectionBody");
        msg(this,&local_108,index);
      }
      Bstrlib::CBString::~CBString(&local_108);
      TreeModel::addInfo(this->model,index,&info,true);
    }
    else {
      usprintf(&local_108,"\nDOS signature: %04Xh, invalid");
      Bstrlib::CBString::operator+=(&info,&local_108);
      Bstrlib::CBString::~CBString(&local_108);
      usprintf(&local_108,"%s: PE32 image with invalid DOS signature","parsePeImageSectionBody");
      msg(this,&local_108,index);
      Bstrlib::CBString::~CBString(&local_108);
      TreeModel::addInfo(this->model,index,&info,true);
    }
  }
LAB_0012f319:
  Bstrlib::CBString::~CBString(&info);
  std::__cxx11::string::~string((string *)&body);
  return 0;
}

Assistant:

USTATUS FfsParser::parsePeImageSectionBody(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Get section body
    UByteArray body = model->body(index);
    if ((UINT32)body.size() < sizeof(EFI_IMAGE_DOS_HEADER)) {
        msg(usprintf("%s: section body size is smaller than DOS header size", __FUNCTION__), index);
        return U_SUCCESS;
    }
    
    UString info;
    const EFI_IMAGE_DOS_HEADER* dosHeader = (const EFI_IMAGE_DOS_HEADER*)body.constData();
    if (dosHeader->e_magic != EFI_IMAGE_DOS_SIGNATURE) {
        info += usprintf("\nDOS signature: %04Xh, invalid", dosHeader->e_magic);
        msg(usprintf("%s: PE32 image with invalid DOS signature", __FUNCTION__), index);
        model->addInfo(index, info);
        return U_SUCCESS;
    }
    
    const EFI_IMAGE_PE_HEADER* peHeader = (EFI_IMAGE_PE_HEADER*)(body.constData() + dosHeader->e_lfanew);
    if (body.size() < (UINT8*)peHeader - (UINT8*)dosHeader) {
        info += UString("\nDOS header: invalid");
        msg(usprintf("%s: PE32 image with invalid DOS header", __FUNCTION__), index);
        model->addInfo(index, info);
        return U_SUCCESS;
    }
    
    if (peHeader->Signature != EFI_IMAGE_PE_SIGNATURE) {
        info += usprintf("\nPE signature: %08Xh, invalid", peHeader->Signature);
        msg(usprintf("%s: PE32 image with invalid PE signature", __FUNCTION__), index);
        model->addInfo(index, info);
        return U_SUCCESS;
    }
    
    const EFI_IMAGE_FILE_HEADER* imageFileHeader = (const EFI_IMAGE_FILE_HEADER*)(peHeader + 1);
    if (body.size() < (UINT8*)imageFileHeader - (UINT8*)dosHeader) {
        info += UString("\nPE header: invalid");
        msg(usprintf("%s: PE32 image with invalid PE header", __FUNCTION__), index);
        model->addInfo(index, info);
        return U_SUCCESS;
    }
    
    info += usprintf("\nDOS signature: %04Xh\nPE signature: %08Xh",
                     dosHeader->e_magic,
                     peHeader->Signature) +
    UString("\nMachine type: ") + machineTypeToUString(imageFileHeader->Machine) +
    usprintf("\nNumber of sections: %u\nCharacteristics: %04Xh",
             imageFileHeader->NumberOfSections,
             imageFileHeader->Characteristics);
    
    EFI_IMAGE_OPTIONAL_HEADER_POINTERS_UNION optionalHeader = {};
    optionalHeader.H32 = (const EFI_IMAGE_OPTIONAL_HEADER32*)(imageFileHeader + 1);
    if (body.size() < (UINT8*)optionalHeader.H32 - (UINT8*)dosHeader) {
        info += UString("\nPE optional header: invalid");
        msg(usprintf("%s: PE32 image with invalid PE optional header", __FUNCTION__), index);
        model->addInfo(index, info);
        return U_SUCCESS;
    }
    
    if (optionalHeader.H32->Magic == EFI_IMAGE_PE_OPTIONAL_HDR32_MAGIC) {
        info += usprintf("\nOptional header signature: %04Xh\nSubsystem: %04Xh\nAddress of entry point: %Xh\nBase of code: %Xh\nImage base: %Xh",
                         optionalHeader.H32->Magic,
                         optionalHeader.H32->Subsystem,
                         optionalHeader.H32->AddressOfEntryPoint,
                         optionalHeader.H32->BaseOfCode,
                         optionalHeader.H32->ImageBase);
    }
    else if (optionalHeader.H32->Magic == EFI_IMAGE_PE_OPTIONAL_HDR64_MAGIC) {
        info += usprintf("\nOptional header signature: %04Xh\nSubsystem: %04Xh\nAddress of entry point: %Xh\nBase of code: %Xh\nImage base: %" PRIX64 "h",
                         optionalHeader.H64->Magic,
                         optionalHeader.H64->Subsystem,
                         optionalHeader.H64->AddressOfEntryPoint,
                         optionalHeader.H64->BaseOfCode,
                         optionalHeader.H64->ImageBase);
    }
    else {
        info += usprintf("\nOptional header signature: %04Xh, unknown", optionalHeader.H32->Magic);
        msg(usprintf("%s: PE32 image with invalid optional PE header signature", __FUNCTION__), index);
    }
    
    model->addInfo(index, info);
    return U_SUCCESS;
}